

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                   (string *__return_storage_ptr__,static_string_view *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   static_string_view *args)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_138;
  cmAlphaNum local_100;
  size_t local_c8;
  char *local_c0;
  cmAlphaNum local_b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_68;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_50;
  iterator local_38;
  undefined8 local_30;
  string_view *local_28;
  static_string_view *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  static_string_view *a_local;
  
  local_c8 = (a->super_string_view)._M_len;
  local_c0 = (a->super_string_view)._M_str;
  local_28 = &args->super_string_view;
  args_local = (static_string_view *)b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (static_string_view *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_b8,a->super_string_view);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_80,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&)
              ::makePair,&local_b8);
  cmAlphaNum::cmAlphaNum(&local_100,(string *)args_local);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_68,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&)
              ::makePair,&local_100);
  cmAlphaNum::cmAlphaNum(&local_138,*local_28);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_50,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&)
              ::makePair,&local_138);
  local_38 = &local_80;
  local_30 = 3;
  views._M_len = 3;
  views._M_array = local_38;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}